

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.cpp
# Opt level: O1

Ref<embree::XML> __thiscall
embree::parseXML(embree *this,Ref<embree::Stream<embree::Token>_> *cin,size_t depth)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _func_int **pp_Var2;
  ssize_t sVar3;
  bool bVar4;
  XML *this_00;
  Token *pTVar5;
  runtime_error *prVar6;
  long *plVar7;
  size_type *psVar8;
  Ref<embree::XML> *xml;
  undefined1 local_308 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2d8;
  XML *local_2c0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_2b8;
  size_t local_2b0;
  Token local_2a8;
  Token local_260;
  string local_218;
  string local_1f8;
  string local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  Token local_78;
  
  local_2c0 = (XML *)this;
  local_2b0 = depth;
  if (0x400 < depth) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    pTVar5 = Stream<embree::Token>::peek(cin->ptr);
    ParseLocation::str_abi_cxx11_((string *)&local_260,&pTVar5->loc);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_260);
    local_308._0_8_ = *plVar7;
    psVar8 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_308._0_8_ == psVar8) {
      local_308._16_8_ = *psVar8;
      aStack_2f0._M_allocated_capacity = plVar7[3];
      local_308._0_8_ = local_308 + 0x10;
    }
    else {
      local_308._16_8_ = *psVar8;
    }
    local_308._8_8_ = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::runtime_error::runtime_error(prVar6,(string *)local_308);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_00 = (XML *)operator_new(0xb0);
  local_308._0_8_ = local_308 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"");
  XML::XML(this_00,(string *)local_308);
  (local_2c0->super_RefCount)._vptr_RefCount = (_func_int **)this_00;
  (*(this_00->super_RefCount)._vptr_RefCount[2])(this_00);
  if ((undefined1 *)local_308._0_8_ != local_308 + 0x10) {
    operator_delete((void *)local_308._0_8_);
  }
  pTVar5 = Stream<embree::Token>::peek(cin->ptr);
  (this_00->loc).fileName.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (pTVar5->loc).fileName.
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this_00->loc).fileName.
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             &(pTVar5->loc).fileName.
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  sVar3 = (pTVar5->loc).colNumber;
  (this_00->loc).lineNumber = (pTVar5->loc).lineNumber;
  (this_00->loc).colNumber = sVar3;
  Stream<embree::Token>::get((Token *)local_308,cin->ptr);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"<","");
  Token::Sym(&local_260,&local_b8);
  bVar4 = operator==((Token *)local_308,&local_260);
  if (local_260.loc.fileName.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_260.loc.fileName.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_260.str._M_dataplus._M_p != (pointer)((long)&local_260 + 0x18U)) {
    operator_delete(local_260.str._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if (local_2d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2d8._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._8_8_ != &aStack_2f0) {
    operator_delete((void *)local_308._8_8_);
  }
  if (!bVar4) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    pTVar5 = Stream<embree::Token>::unget(cin->ptr,1);
    ParseLocation::str_abi_cxx11_((string *)&local_260,&pTVar5->loc);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_260);
    local_308._0_8_ = *plVar7;
    psVar8 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_308._0_8_ == psVar8) {
      local_308._16_8_ = *psVar8;
      aStack_2f0._M_allocated_capacity = plVar7[3];
      local_308._0_8_ = local_308 + 0x10;
    }
    else {
      local_308._16_8_ = *psVar8;
    }
    local_308._8_8_ = plVar7[1];
    *plVar7 = (long)psVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::runtime_error::runtime_error(prVar6,(string *)local_308);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  Stream<embree::Token>::get((Token *)local_308,cin->ptr);
  Token::Identifier_abi_cxx11_((string *)&local_260,(Token *)local_308);
  std::__cxx11::string::operator=((string *)&this_00->name,(string *)&local_260);
  if ((pointer)local_260._0_8_ != (pointer)((long)&local_260 + 0x10U)) {
    operator_delete((void *)local_260._0_8_);
  }
  if (local_2d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2d8._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._8_8_ != &aStack_2f0) {
    operator_delete((void *)local_308._8_8_);
  }
  parseComments(cin);
  local_2b8 = &this_00->parms;
  while( true ) {
    pTVar5 = Stream<embree::Token>::peek(cin->ptr);
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"/>","");
    Token::Sym((Token *)local_308,&local_d8);
    bVar4 = operator==(pTVar5,(Token *)local_308);
    if (bVar4) {
      bVar4 = false;
    }
    else {
      pTVar5 = Stream<embree::Token>::peek(cin->ptr);
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,">","");
      Token::Sym(&local_260,&local_1f8);
      bVar4 = operator==(pTVar5,&local_260);
      bVar4 = !bVar4;
      if (local_260.loc.fileName.
          super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_260.loc.fileName.
                   super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_260.str._M_dataplus._M_p != (pointer)((long)&local_260 + 0x18U)) {
        operator_delete(local_260.str._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p);
      }
    }
    if (local_2d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2d8._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._8_8_ != &aStack_2f0) {
      operator_delete((void *)local_308._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    if (!bVar4) break;
    parseParm(cin,local_2b8);
    parseComments(cin);
  }
  pTVar5 = Stream<embree::Token>::peek(cin->ptr);
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"/>","");
  Token::Sym((Token *)local_308,&local_f8);
  bVar4 = operator==(pTVar5,(Token *)local_308);
  if (local_2d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2d8._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._8_8_ != &aStack_2f0) {
    operator_delete((void *)local_308._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  if (bVar4) {
    Stream<embree::Token>::drop(cin->ptr);
  }
  else {
    Stream<embree::Token>::drop(cin->ptr);
    parseComments(cin);
    local_2b8 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)((local_2c0->super_RefCount)._vptr_RefCount + 0x13);
    while( true ) {
      pTVar5 = Stream<embree::Token>::peek(cin->ptr);
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"<","");
      Token::Sym((Token *)local_308,&local_118);
      bVar4 = operator==(pTVar5,(Token *)local_308);
      if (bVar4) {
        bVar4 = false;
      }
      else {
        pTVar5 = Stream<embree::Token>::peek(cin->ptr);
        local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"</","");
        Token::Sym(&local_78,&local_218);
        bVar4 = operator==(pTVar5,&local_78);
        bVar4 = !bVar4;
        if (local_78.loc.fileName.
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_78.loc.fileName.
                     super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78.str._M_dataplus._M_p != &local_78.str.field_2) {
          operator_delete(local_78.str._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p);
        }
      }
      if (local_2d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2d8._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._8_8_ != &aStack_2f0) {
        operator_delete((void *)local_308._8_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      if (!bVar4) break;
      Stream<embree::Token>::get((Token *)local_308,cin->ptr);
      std::vector<embree::Token,_std::allocator<embree::Token>_>::emplace_back<embree::Token>
                ((vector<embree::Token,_std::allocator<embree::Token>_> *)local_2b8,
                 (Token *)local_308);
      if (local_2d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2d8._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._8_8_ != &aStack_2f0) {
        operator_delete((void *)local_308._8_8_);
      }
      parseComments(cin);
    }
    pTVar5 = Stream<embree::Token>::peek(cin->ptr);
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"<","");
    Token::Sym((Token *)local_308,&local_138);
    bVar4 = operator==(pTVar5,(Token *)local_308);
    if (local_2d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2d8._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._8_8_ != &aStack_2f0) {
      operator_delete((void *)local_308._8_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    if (bVar4) {
      pp_Var2 = (local_2c0->super_RefCount)._vptr_RefCount;
      local_2b0 = local_2b0 + 1;
      while( true ) {
        pTVar5 = Stream<embree::Token>::peek(cin->ptr);
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"</","");
        Token::Sym((Token *)local_308,&local_158);
        bVar4 = operator==(pTVar5,(Token *)local_308);
        if (local_2d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2d8._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308._8_8_ != &aStack_2f0) {
          operator_delete((void *)local_308._8_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p);
        }
        if (bVar4) break;
        parseXML((embree *)local_308,cin,local_2b0);
        std::vector<embree::Ref<embree::XML>,std::allocator<embree::Ref<embree::XML>>>::
        emplace_back<embree::Ref<embree::XML>>
                  ((vector<embree::Ref<embree::XML>,std::allocator<embree::Ref<embree::XML>>> *)
                   (pp_Var2 + 0x10),(Ref<embree::XML> *)local_308);
        if ((long *)local_308._0_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_308._0_8_ + 0x18))();
        }
        parseComments(cin);
      }
    }
    Stream<embree::Token>::get((Token *)local_308,cin->ptr);
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"</","");
    Token::Sym(&local_2a8,&local_178);
    bVar4 = operator==((Token *)local_308,&local_2a8);
    if (local_2a8.loc.fileName.
        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_2a8.loc.fileName.
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    paVar1 = &local_2a8.str.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8.str._M_dataplus._M_p != paVar1) {
      operator_delete(local_2a8.str._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    if (local_2d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2d8._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._8_8_ != &aStack_2f0) {
      operator_delete((void *)local_308._8_8_);
    }
    if (!bVar4) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      pTVar5 = Stream<embree::Token>::unget(cin->ptr,1);
      ParseLocation::str_abi_cxx11_((string *)&local_2a8,&pTVar5->loc);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2a8);
      local_308._0_8_ = *plVar7;
      psVar8 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_308._0_8_ == psVar8) {
        local_308._16_8_ = *psVar8;
        aStack_2f0._M_allocated_capacity = plVar7[3];
        local_308._0_8_ = local_308 + 0x10;
      }
      else {
        local_308._16_8_ = *psVar8;
      }
      local_308._8_8_ = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::runtime_error::runtime_error(prVar6,(string *)local_308);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    Stream<embree::Token>::get((Token *)local_308,cin->ptr);
    pp_Var2 = (local_2c0->super_RefCount)._vptr_RefCount;
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_198,pp_Var2[6],pp_Var2[7] + (long)pp_Var2[6]);
    Token::Id(&local_2a8,&local_198);
    bVar4 = operator==((Token *)local_308,&local_2a8);
    if (local_2a8.loc.fileName.
        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_2a8.loc.fileName.
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8.str._M_dataplus._M_p != paVar1) {
      operator_delete(local_2a8.str._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p);
    }
    if (local_2d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2d8._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._8_8_ != &aStack_2f0) {
      operator_delete((void *)local_308._8_8_);
    }
    if (!bVar4) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      pTVar5 = Stream<embree::Token>::unget(cin->ptr,1);
      ParseLocation::str_abi_cxx11_(&local_98,&pTVar5->loc);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_98);
      local_1b8._M_dataplus._M_p = (pointer)*plVar7;
      psVar8 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_1b8._M_dataplus._M_p == psVar8) {
        local_1b8.field_2._M_allocated_capacity = *psVar8;
        local_1b8.field_2._8_8_ = plVar7[3];
        local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      }
      else {
        local_1b8.field_2._M_allocated_capacity = *psVar8;
      }
      local_1b8._M_string_length = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2a8
                     ,&local_1b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (pp_Var2 + 6));
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2a8);
      local_308._0_8_ = *plVar7;
      psVar8 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_308._0_8_ == psVar8) {
        local_308._16_8_ = *psVar8;
        aStack_2f0._M_allocated_capacity = plVar7[3];
        local_308._0_8_ = local_308 + 0x10;
      }
      else {
        local_308._16_8_ = *psVar8;
      }
      local_308._8_8_ = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::runtime_error::runtime_error(prVar6,(string *)local_308);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    Stream<embree::Token>::get((Token *)local_308,cin->ptr);
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,">","");
    Token::Sym(&local_2a8,&local_1d8);
    bVar4 = operator==((Token *)local_308,&local_2a8);
    if (local_2a8.loc.fileName.
        super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_2a8.loc.fileName.
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8.str._M_dataplus._M_p != paVar1) {
      operator_delete(local_2a8.str._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p);
    }
    if (local_2d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2d8._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._8_8_ != &aStack_2f0) {
      operator_delete((void *)local_308._8_8_);
    }
    if (!bVar4) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      pTVar5 = Stream<embree::Token>::unget(cin->ptr,1);
      ParseLocation::str_abi_cxx11_((string *)&local_2a8,&pTVar5->loc);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2a8);
      local_308._0_8_ = *plVar7;
      psVar8 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_308._0_8_ == psVar8) {
        local_308._16_8_ = *psVar8;
        aStack_2f0._M_allocated_capacity = plVar7[3];
        local_308._0_8_ = local_308 + 0x10;
      }
      else {
        local_308._16_8_ = *psVar8;
      }
      local_308._8_8_ = plVar7[1];
      *plVar7 = (long)psVar8;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::runtime_error::runtime_error(prVar6,(string *)local_308);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return (Ref<embree::XML>)local_2c0;
}

Assistant:

Ref<XML> parseXML(Ref<Stream<Token> >& cin, size_t depth)
  {
    if (depth > 1024)
      THROW_RUNTIME_ERROR(cin->peek().Location().str()+": maximal nesting depth reached");
      
    Ref<XML> xml = new XML;
    xml->loc = cin->peek().Location();

    /* parse tag opening */
    if (cin->get() != Token::Sym("<")) THROW_RUNTIME_ERROR(cin->unget().Location().str()+": tag expected");

    xml->name = cin->get().Identifier();
    parseComments(cin);
    while (cin->peek() != Token::Sym("/>") && cin->peek() != Token::Sym(">")) {
      parseParm(cin,xml->parms);
      parseComments(cin);
    }
    if (cin->peek() == Token::Sym("/>")) {
      cin->drop();
      return xml;
    }
    cin->drop();

    /* parse body token list */
    parseComments(cin);
    while (cin->peek() != Token::Sym("<") && cin->peek() != Token::Sym("</")) {
      xml->body.push_back(cin->get());
      parseComments(cin);
    }

    /* the body also contains children */
    if (cin->peek() == Token::Sym("<")) {
      while (cin->peek() != Token::Sym("</")) {
        xml->children.push_back(parseXML(cin,depth+1));
        parseComments(cin);
      }
    }

    /* parse tag closing */
    if (cin->get() != Token::Sym("</")    ) THROW_RUNTIME_ERROR(cin->unget().Location().str()+": symbol \"</\" expected");
    if (cin->get() != Token::Id(xml->name)) THROW_RUNTIME_ERROR(cin->unget().Location().str()+": closing "+xml->name+" expected");
    if (cin->get() != Token::Sym(">")     ) THROW_RUNTIME_ERROR(cin->unget().Location().str()+": symbol \">\" expected");

    return xml;
  }